

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O3

string * __thiscall
t_rs_generator::struct_to_invocation
          (string *__return_storage_ptr__,t_rs_generator *this,t_struct *tstruct,
          string *field_prefix)

{
  t_field *tfield;
  bool bVar1;
  ostream *poVar2;
  pointer pptVar3;
  vector<t_field_*,_std::allocator<t_field_*>_> fields;
  ostringstream args;
  vector<t_field_*,_std::allocator<t_field_*>_> local_1e0;
  string local_1c8;
  undefined1 local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::vector<t_field_*,_std::allocator<t_field_*>_>::vector
            (&local_1e0,&tstruct->members_in_id_order_);
  if (local_1e0.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_1e0.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    bVar1 = true;
    pptVar3 = local_1e0.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      tfield = *pptVar3;
      if (!bVar1) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
      }
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(field_prefix->_M_dataplus)._M_p,
                          field_prefix->_M_string_length);
      rust_field_name_abi_cxx11_(&local_1c8,this,tfield);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p);
      }
      pptVar3 = pptVar3 + 1;
      bVar1 = false;
    } while (pptVar3 !=
             local_1e0.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  std::__cxx11::stringbuf::str();
  if (local_1e0.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1e0.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

string t_rs_generator::struct_to_invocation(t_struct* tstruct, const string& field_prefix) {
  ostringstream args;

  bool first_arg = true;
  std::vector<t_field*> fields = tstruct->get_sorted_members();
  std::vector<t_field*>::iterator field_iter;
  for (field_iter = fields.begin(); field_iter != fields.end(); ++field_iter) {
    t_field* tfield = (*field_iter);

    if (first_arg) {
      first_arg = false;
    } else {
      args << ", ";
    }

    args << field_prefix << rust_field_name(tfield);
  }

  return args.str();
}